

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync_common.hpp
# Opt level: O3

void __thiscall
oqpi::global_sync_object<oqpi::posix_semaphore>::global_sync_object<int&,int&>
          (global_sync_object<oqpi::posix_semaphore> *this,string *name,
          sync_object_creation_options creationOption,int *args,int *args_1)

{
  int32_t initCount;
  pointer pcVar1;
  
  initCount = *args;
  (this->super_posix_semaphore).maxCount_ = *args_1;
  posix_semaphore_wrapper::posix_semaphore_wrapper
            (&(this->super_posix_semaphore).sem_,name,creationOption,initCount);
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + name->_M_string_length);
  return;
}

Assistant:

global_sync_object(const std::string &name, sync_object_creation_options creationOption, _Args &&...args)
            : _Impl(name, creationOption, std::forward<_Args>(args)...)
            , name_(name)
        {}